

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex.cpp
# Opt level: O0

Element __thiscall ftxui::notflex(ftxui *this,Element *child)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  shared_ptr<ftxui::Flex> local_28;
  Element *local_18;
  Element *child_local;
  
  local_18 = child;
  child_local = (Element *)this;
  std::make_shared<ftxui::Flex,void(&)(ftxui::Requirement&),std::shared_ptr<ftxui::Node>>
            ((_func_void_Requirement_ptr *)&local_28,
             (shared_ptr<ftxui::Node> *)anon_unknown_4::function_not_flex);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::Flex,void>
            ((shared_ptr<ftxui::Node> *)this,&local_28);
  std::shared_ptr<ftxui::Flex>::~shared_ptr(&local_28);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element notflex(Element child) {
  return std::make_shared<Flex>(function_not_flex, std::move(child));
}